

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O3

int __thiscall CTPNStmTry::gen_code_break(CTPNStmTry *this,textchar_t *lbl,size_t lbl_len)

{
  CTPNStmEnclosing *pCVar1;
  int iVar2;
  
  gen_jsr_finally(this);
  pCVar1 = (this->super_CTPNStmTryBase).super_CTPNStmEnclosing.enclosing_;
  if (pCVar1 != (CTPNStmEnclosing *)0x0) {
    iVar2 = (*(pCVar1->super_CTPNStm).super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
              _vptr_CTcPrsNodeBase[0x1f])(pCVar1,lbl,lbl_len);
    return iVar2;
  }
  return 0;
}

Assistant:

int CTPNStmTry::gen_code_break(const textchar_t *lbl, size_t lbl_len)
{
    /* if we have a 'finally' block, invoke it as a local subroutine call */
    gen_jsr_finally();

    /* 
     *   If there's an enclosing statement, let it generate the break; if
     *   there's not, return failure, because we're not a meaningful
     *   target for break.
     */
    if (enclosing_)
        return enclosing_->gen_code_break(lbl, lbl_len);
    else
        return FALSE;
}